

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void get_variance_stats(AV1_COMP *cpi,MACROBLOCK *x,int num_planes,int64_t *src_var,int64_t *rec_var
                       )

{
  BLOCK_SIZE BVar1;
  uint8_t uVar2;
  MB_MODE_INFO *pMVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  long *plVar5;
  macroblock_plane *p;
  uint sse;
  uint8_t dclevel [16384];
  uint local_403c;
  uint8_t local_4038 [16392];
  
  plVar5 = (long *)CONCAT44(in_register_00000014,num_planes);
  pMVar3 = *(x->e_mbd).mi;
  memset(local_4038,0x80,0x4000);
  BVar1 = pMVar3->bsize;
  uVar2 = block_size_wide[BVar1];
  *plVar5 = 0;
  *src_var = 0;
  BVar1 = av1_ss_size_lookup[BVar1][(x->e_mbd).plane[0].subsampling_x]
          [(x->e_mbd).plane[0].subsampling_y];
  uVar4 = (*cpi->ppi->fn_ptr[BVar1].vf)
                    (x->plane[0].src.buf,x->plane[0].src.stride,local_4038,(int)uVar2,&local_403c);
  *plVar5 = *plVar5 + (ulong)uVar4;
  uVar4 = (*cpi->ppi->fn_ptr[BVar1].vf)
                    ((x->e_mbd).plane[0].dst.buf,(x->e_mbd).plane[0].dst.stride,local_4038,
                     (int)uVar2,&local_403c);
  *src_var = *src_var + (ulong)uVar4;
  *plVar5 = *plVar5 << 4;
  *src_var = *src_var << 4;
  return;
}

Assistant:

static void get_variance_stats(const AV1_COMP *cpi, const MACROBLOCK *x,
                               int num_planes, int64_t *src_var,
                               int64_t *rec_var) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];

  DECLARE_ALIGNED(16, uint8_t, dclevel[MAX_SB_SQUARE]);
  memset(dclevel, 128, sizeof(dclevel));
  int dclevel_stride = block_size_wide[mbmi->bsize];

  *src_var = 0;
  *rec_var = 0;

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;

    const struct macroblock_plane *const p = &x->plane[plane];
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);
    unsigned int sse;

    int64_t var = cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, dclevel,
                                          dclevel_stride, &sse);

    *src_var += var;

    var = cpi->ppi->fn_ptr[bs].vf(pd->dst.buf, pd->dst.stride, dclevel,
                                  dclevel_stride, &sse);

    *rec_var += var;
  }

  *src_var <<= 4;
  *rec_var <<= 4;
}